

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greedy-lineage.hxx
# Opt level: O0

void __thiscall
lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::removeVertex
          (DynamicLineage<std::vector<double,_std::allocator<double>_>_> *this,size_t v)

{
  bool bVar1;
  reference this_00;
  size_type in_RSI;
  map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
  *in_RDI;
  pair<const_unsigned_long,_double> *p;
  iterator __end0;
  iterator __begin0;
  value_type *__range3;
  _Self local_28;
  _Self local_20;
  reference local_18;
  size_type local_10;
  
  local_10 = in_RSI;
  local_18 = std::
             vector<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>,_std::allocator<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
             ::operator[]((vector<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>,_std::allocator<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
                           *)&(in_RDI->_M_t)._M_impl.super__Rb_tree_header,in_RSI);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
       ::begin(in_RDI);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
       ::end(in_RDI);
  while( true ) {
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    this_00 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_double>_>::operator*
                        ((_Rb_tree_iterator<std::pair<const_unsigned_long,_double>_> *)0x17b9a7);
    std::
    vector<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>,_std::allocator<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
    ::operator[]((vector<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>,_std::allocator<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
                  *)&(in_RDI->_M_t)._M_impl.super__Rb_tree_header,this_00->first);
    std::
    map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
    ::erase((map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
             *)this_00,(key_type *)in_RDI);
    std::_Rb_tree_iterator<std::pair<const_unsigned_long,_double>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_unsigned_long,_double>_> *)this_00);
  }
  std::
  vector<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>,_std::allocator<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
  ::operator[]((vector<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>,_std::allocator<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
                *)&(in_RDI->_M_t)._M_impl.super__Rb_tree_header,local_10);
  std::
  map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
  ::clear((map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
           *)0x17b9f4);
  return;
}

Assistant:

inline void removeVertex(size_t v)
    {
        for (auto& p : vertices_[v])
            vertices_[p.first].erase(v);

        vertices_[v].clear();
    }